

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  RTCRayQueryContext *pRVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  char cVar19;
  bool bVar20;
  int iVar21;
  undefined4 uVar22;
  RTCIntersectArguments *pRVar23;
  uint uVar24;
  ulong uVar25;
  ulong *puVar26;
  long lVar27;
  RTCRayQueryContext *pRVar28;
  NodeRef root;
  undefined1 (*pauVar29) [32];
  ulong uVar30;
  undefined1 auVar31 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [16];
  float fVar47;
  float fVar49;
  float fVar50;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar63;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar75;
  undefined1 auVar70 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float in_register_0000131c;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [16];
  float fVar84;
  float in_register_0000135c;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  vfloat4 a0;
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [64];
  float fVar112;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [64];
  float fVar123;
  undefined1 auVar122 [64];
  float fVar124;
  undefined1 auVar125 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [64];
  undefined1 in_ZMM15 [64];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5c80 [20];
  uint uStack_5c6c;
  uint uStack_5c68;
  uint uStack_5c64;
  ulong local_5c58;
  BVH *local_5c50;
  RayK<8> *local_5c48;
  RTCRayQueryContext **local_5c40;
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  RTCIntersectArguments *local_5c20;
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ba0;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [64];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  RTCIntersectArguments local_59a0;
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar33 [16];
  undefined1 auVar34 [28];
  undefined1 auVar71 [64];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar89 [64];
  undefined1 auVar96 [64];
  
  local_5c50 = (BVH *)This->ptr;
  sVar3 = (local_5c50->root).ptr;
  if (sVar3 != 8) {
    auVar52 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar76 = vpcmpeqd_avx(auVar52,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar52 = vpcmpeqd_avx(auVar52,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar41 = *(undefined1 (*) [32])(ray + 0x100);
    auVar69 = vcmpps_avx(auVar41,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar35._16_16_ = auVar52;
    auVar35._0_16_ = auVar76;
    local_5be0 = vandps_avx(auVar69,auVar35);
    uVar24 = vmovmskps_avx(local_5be0);
    if (uVar24 != 0) {
      local_5c48 = ray + 0x100;
      pRVar23 = &local_59a0;
      _local_5b40 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5b20 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar78._0_4_ =
           local_5b40._0_4_ * local_5b40._0_4_ +
           local_5b00._0_4_ * local_5b00._0_4_ + local_5b20._0_4_ * local_5b20._0_4_;
      auVar78._4_4_ =
           local_5b40._4_4_ * local_5b40._4_4_ +
           local_5b00._4_4_ * local_5b00._4_4_ + local_5b20._4_4_ * local_5b20._4_4_;
      auVar78._8_4_ =
           local_5b40._8_4_ * local_5b40._8_4_ +
           local_5b00._8_4_ * local_5b00._8_4_ + local_5b20._8_4_ * local_5b20._8_4_;
      auVar78._12_4_ =
           local_5b40._12_4_ * local_5b40._12_4_ +
           local_5b00._12_4_ * local_5b00._12_4_ + local_5b20._12_4_ * local_5b20._12_4_;
      auVar78._16_4_ =
           local_5b40._16_4_ * local_5b40._16_4_ +
           local_5b00._16_4_ * local_5b00._16_4_ + local_5b20._16_4_ * local_5b20._16_4_;
      auVar78._20_4_ =
           local_5b40._20_4_ * local_5b40._20_4_ +
           local_5b00._20_4_ * local_5b00._20_4_ + local_5b20._20_4_ * local_5b20._20_4_;
      auVar78._24_4_ =
           local_5b40._24_4_ * local_5b40._24_4_ +
           local_5b00._24_4_ * local_5b00._24_4_ + local_5b20._24_4_ * local_5b20._24_4_;
      auVar78._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar69 = vrsqrtps_avx(auVar78);
      uVar25 = (ulong)(uVar24 & 0xff);
      fVar47 = auVar69._0_4_;
      fVar49 = auVar69._4_4_;
      fVar50 = auVar69._8_4_;
      fVar51 = auVar69._12_4_;
      fVar84 = auVar69._16_4_;
      fVar60 = auVar69._20_4_;
      fVar62 = auVar69._24_4_;
      local_59c0.v[0] = fVar47 * 1.5 + fVar47 * fVar47 * fVar47 * auVar78._0_4_ * -0.5;
      local_59c0.v[1] = fVar49 * 1.5 + fVar49 * fVar49 * fVar49 * auVar78._4_4_ * -0.5;
      local_59c0.v[2] = fVar50 * 1.5 + fVar50 * fVar50 * fVar50 * auVar78._8_4_ * -0.5;
      local_59c0.v[3] = fVar51 * 1.5 + fVar51 * fVar51 * fVar51 * auVar78._12_4_ * -0.5;
      local_59c0.v[4] = fVar84 * 1.5 + fVar84 * fVar84 * fVar84 * auVar78._16_4_ * -0.5;
      local_59c0.v[5] = fVar60 * 1.5 + fVar60 * fVar60 * fVar60 * auVar78._20_4_ * -0.5;
      local_59c0.v[6] = fVar62 * 1.5 + fVar62 * fVar62 * fVar62 * auVar78._24_4_ * -0.5;
      local_59c0.v[7] = auVar78._28_4_ + 1.5;
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar76 = ZEXT816(0) << 0x20;
      do {
        lVar27 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar27 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar27 * 4 + 0xa0)),0x1c);
        auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + lVar27 * 4 + 0xc0)),0x28);
        fVar47 = *(float *)((long)&local_59c0 + lVar27 * 4);
        auVar93._0_4_ = auVar64._0_4_ * fVar47;
        auVar93._4_4_ = auVar64._4_4_ * fVar47;
        auVar93._8_4_ = auVar64._8_4_ * fVar47;
        auVar93._12_4_ = auVar64._12_4_ * fVar47;
        auVar102 = vshufpd_avx(auVar93,auVar93,1);
        auVar64 = vmovshdup_avx(auVar93);
        auVar97 = vunpckhps_avx(auVar93,auVar76);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = (ulong)auVar64._0_4_ ^ 0x80000000;
        auVar48 = vshufps_avx(auVar97,auVar101,0x41);
        auVar97._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
        auVar97._8_8_ = auVar102._8_8_ ^ auVar52._8_8_;
        auVar97 = vinsertps_avx(auVar97,auVar93,0x2a);
        auVar64 = vdpps_avx(auVar48,auVar48,0x7f);
        auVar102 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar64 = vcmpps_avx(auVar102,auVar64,1);
        auVar64 = vshufps_avx(auVar64,auVar64,0);
        auVar64 = vblendvps_avx(auVar97,auVar48,auVar64);
        auVar102 = vdpps_avx(auVar64,auVar64,0x7f);
        auVar97 = vrsqrtss_avx(auVar102,auVar102);
        fVar49 = auVar97._0_4_;
        auVar102 = ZEXT416((uint)(fVar49 * 1.5 - auVar102._0_4_ * 0.5 * fVar49 * fVar49 * fVar49));
        auVar102 = vshufps_avx(auVar102,auVar102,0);
        auVar48._0_4_ = auVar64._0_4_ * auVar102._0_4_;
        auVar48._4_4_ = auVar64._4_4_ * auVar102._4_4_;
        auVar48._8_4_ = auVar64._8_4_ * auVar102._8_4_;
        auVar48._12_4_ = auVar64._12_4_ * auVar102._12_4_;
        auVar64 = vshufps_avx(auVar48,auVar48,0xc9);
        auVar102 = vshufps_avx(auVar93,auVar93,0xc9);
        auVar113._0_4_ = auVar102._0_4_ * auVar48._0_4_;
        auVar113._4_4_ = auVar102._4_4_ * auVar48._4_4_;
        auVar113._8_4_ = auVar102._8_4_ * auVar48._8_4_;
        auVar113._12_4_ = auVar102._12_4_ * auVar48._12_4_;
        auVar102._0_4_ = auVar93._0_4_ * auVar64._0_4_;
        auVar102._4_4_ = auVar93._4_4_ * auVar64._4_4_;
        auVar102._8_4_ = auVar93._8_4_ * auVar64._8_4_;
        auVar102._12_4_ = auVar93._12_4_ * auVar64._12_4_;
        auVar64 = vsubps_avx(auVar102,auVar113);
        auVar97 = vshufps_avx(auVar64,auVar64,0xc9);
        auVar64 = vdpps_avx(auVar97,auVar97,0x7f);
        lVar27 = lVar27 * 0x30;
        auVar102 = vrsqrtss_avx(auVar64,auVar64);
        fVar49 = auVar102._0_4_;
        auVar126 = ZEXT464((uint)(fVar49 * 1.5));
        auVar64 = ZEXT416((uint)(fVar49 * 1.5 - auVar64._0_4_ * 0.5 * fVar49 * fVar49 * fVar49));
        auVar64 = vshufps_avx(auVar64,auVar64,0);
        auVar103._0_4_ = auVar64._0_4_ * auVar97._0_4_;
        auVar103._4_4_ = auVar64._4_4_ * auVar97._4_4_;
        auVar103._8_4_ = auVar64._8_4_ * auVar97._8_4_;
        auVar103._12_4_ = auVar64._12_4_ * auVar97._12_4_;
        auVar64._0_4_ = fVar47 * auVar93._0_4_;
        auVar64._4_4_ = fVar47 * auVar93._4_4_;
        auVar64._8_4_ = fVar47 * auVar93._8_4_;
        auVar64._12_4_ = fVar47 * auVar93._12_4_;
        auVar97 = vunpcklps_avx(auVar48,auVar64);
        auVar64 = vunpckhps_avx(auVar48,auVar64);
        auVar48 = vunpcklps_avx(auVar103,auVar76);
        auVar99 = ZEXT1664(auVar48);
        auVar102 = vunpckhps_avx(auVar103,auVar76);
        auVar102 = vunpcklps_avx(auVar64,auVar102);
        auVar93 = vunpcklps_avx(auVar97,auVar48);
        auVar64 = vunpckhps_avx(auVar97,auVar48);
        ((RayQueryContext *)((long)pRVar23 + lVar27))->scene = (Scene *)auVar93._0_8_;
        ((RayQueryContext *)((long)pRVar23 + lVar27))->user = (RTCRayQueryContext *)auVar93._8_8_;
        *(undefined1 (*) [16])(auStack_5980 + lVar27 + -0x10) = auVar64;
        *(undefined1 (*) [16])(auStack_5980 + lVar27) = auVar102;
        uVar25 = uVar25 & uVar25 - 1;
      } while (uVar25 != 0);
      local_5ba0._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5ba0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5ba0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5ba0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5ba0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5ba0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5ba0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5ba0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5ba0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5ba0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5ba0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5ba0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5ba0._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5ba0._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5ba0._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5ba0._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5ba0._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5ba0._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5ba0._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5ba0._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5ba0._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5ba0._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5ba0._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5ba0._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar86._8_4_ = 0x7fffffff;
      auVar86._0_8_ = 0x7fffffff7fffffff;
      auVar86._12_4_ = 0x7fffffff;
      auVar86._16_4_ = 0x7fffffff;
      auVar86._20_4_ = 0x7fffffff;
      auVar86._24_4_ = 0x7fffffff;
      auVar86._28_4_ = 0x7fffffff;
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar91._16_4_ = 0x219392ef;
      auVar91._20_4_ = 0x219392ef;
      auVar91._24_4_ = 0x219392ef;
      auVar91._28_4_ = 0x219392ef;
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar96 = ZEXT3264(auVar94);
      auVar66 = vdivps_avx(auVar94,_local_5b40);
      auVar69 = vandps_avx(_local_5b40,auVar86);
      auVar35 = vcmpps_avx(auVar69,auVar91,1);
      auVar69 = vandps_avx(_local_5b20,auVar86);
      auVar78 = vcmpps_avx(auVar69,auVar91,1);
      auVar67 = vdivps_avx(auVar94,_local_5b20);
      auVar69 = vandps_avx(_local_5b00,auVar86);
      auVar90._8_4_ = 0x5d5e0b6b;
      auVar90._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar90._12_4_ = 0x5d5e0b6b;
      auVar90._16_4_ = 0x5d5e0b6b;
      auVar90._20_4_ = 0x5d5e0b6b;
      auVar90._24_4_ = 0x5d5e0b6b;
      auVar90._28_4_ = 0x5d5e0b6b;
      _local_5ae0 = vblendvps_avx(auVar66,auVar90,auVar35);
      auVar69 = vcmpps_avx(auVar69,auVar91,1);
      auVar35 = vdivps_avx(auVar94,_local_5b00);
      local_5ac0 = vblendvps_avx(auVar67,auVar90,auVar78);
      local_5aa0 = vblendvps_avx(auVar35,auVar90,auVar69);
      auVar69 = vcmpps_avx(_local_5ae0,ZEXT832(0) << 0x20,1);
      auVar66._8_4_ = 0x20;
      auVar66._0_8_ = 0x2000000020;
      auVar66._12_4_ = 0x20;
      auVar66._16_4_ = 0x20;
      auVar66._20_4_ = 0x20;
      auVar66._24_4_ = 0x20;
      auVar66._28_4_ = 0x20;
      local_5a80 = vandps_avx(auVar69,auVar66);
      auVar69 = vcmpps_avx(local_5ac0,ZEXT832(0) << 0x20,5);
      auVar67._8_4_ = 0x40;
      auVar67._0_8_ = 0x4000000040;
      auVar67._12_4_ = 0x40;
      auVar67._16_4_ = 0x40;
      auVar67._20_4_ = 0x40;
      auVar67._24_4_ = 0x40;
      auVar67._28_4_ = 0x40;
      auVar87._8_4_ = 0x60;
      auVar87._0_8_ = 0x6000000060;
      auVar87._12_4_ = 0x60;
      auVar87._16_4_ = 0x60;
      auVar87._20_4_ = 0x60;
      auVar87._24_4_ = 0x60;
      auVar87._28_4_ = 0x60;
      auVar89 = ZEXT3264(auVar87);
      local_5a60 = vblendvps_avx(auVar87,auVar67,auVar69);
      auVar35 = ZEXT832(0) << 0x20;
      auVar69 = vcmpps_avx(local_5aa0,auVar35,5);
      auVar68._8_4_ = 0x80;
      auVar68._0_8_ = 0x8000000080;
      auVar68._12_4_ = 0x80;
      auVar68._16_4_ = 0x80;
      auVar68._20_4_ = 0x80;
      auVar68._24_4_ = 0x80;
      auVar68._28_4_ = 0x80;
      auVar79._8_4_ = 0xa0;
      auVar79._0_8_ = 0xa0000000a0;
      auVar79._12_4_ = 0xa0;
      auVar79._16_4_ = 0xa0;
      auVar79._20_4_ = 0xa0;
      auVar79._24_4_ = 0xa0;
      auVar79._28_4_ = 0xa0;
      local_5a40 = vblendvps_avx(auVar79,auVar68,auVar69);
      auVar69 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar35);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar105 = ZEXT3264(local_4680);
      auVar59 = ZEXT3264(local_5be0);
      local_5a20 = vblendvps_avx(local_4680,auVar69,local_5be0);
      auVar41 = vmaxps_avx(auVar41,auVar35);
      auVar69._8_4_ = 0xff800000;
      auVar69._0_8_ = 0xff800000ff800000;
      auVar69._12_4_ = 0xff800000;
      auVar69._16_4_ = 0xff800000;
      auVar69._20_4_ = 0xff800000;
      auVar69._24_4_ = 0xff800000;
      auVar69._28_4_ = 0xff800000;
      auVar71 = ZEXT3264(auVar69);
      local_5a00._0_32_ = vblendvps_avx(auVar69,auVar41,local_5be0);
      auVar41 = vcmpps_avx(local_5a00._0_32_,local_5a00._0_32_,0xf);
      local_5c80._4_4_ = local_5be0._4_4_ ^ auVar41._4_4_;
      local_5c80._0_4_ = local_5be0._0_4_ ^ auVar41._0_4_;
      local_5c80._8_4_ = local_5be0._8_4_ ^ auVar41._8_4_;
      local_5c80._12_4_ = local_5be0._12_4_ ^ auVar41._12_4_;
      local_5c80._16_4_ = local_5be0._16_4_ ^ auVar41._16_4_;
      uStack_5c6c = local_5be0._20_4_ ^ auVar41._20_4_;
      uStack_5c68 = local_5be0._24_4_ ^ auVar41._24_4_;
      uStack_5c64 = local_5be0._28_4_ ^ auVar41._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 7;
      }
      else {
        pRVar23 = context->args;
        uVar25 = (ulong)(((ulong)*(Scene **)&pRVar23->flags & 0x10000) == 0) * 5 + 2;
      }
      puVar26 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar29 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar3;
      local_4660 = local_5a20;
      local_5a00._32_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._40_8_ = mm_lookupmask_ps._24_8_;
      local_5a00._48_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._56_8_ = mm_lookupmask_ps._24_8_;
      auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar122 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
LAB_0043de7b:
      do {
        do {
          auVar52 = auVar59._0_16_;
          root.ptr = puVar26[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0043e600;
          puVar26 = puVar26 + -1;
          pauVar29 = pauVar29 + -1;
          local_5c00 = *pauVar29;
          auVar46 = ZEXT3264(local_5c00);
          auVar41 = vcmpps_avx(local_5c00,local_5a00._0_32_,1);
        } while ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar41 >> 0x7f,0) == '\0') &&
                   (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar41 >> 0xbf,0) == '\0') &&
                 (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar41[0x1f]);
        uVar22 = vmovmskps_avx(auVar41);
        pRVar23 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar23 >> 0x20),uVar22);
        uVar30 = (ulong)(uint)POPCOUNT(uVar22);
        local_5c20 = pRVar23;
        if (uVar25 < (uint)POPCOUNT(uVar22)) {
LAB_0043deb8:
          do {
            iVar21 = 4;
            lVar27 = 0x38;
            if ((root.ptr & 8) != 0) {
              if ((RTCRayQueryContext *)root.ptr == (RTCRayQueryContext *)0xfffffffffffffff8)
              goto LAB_0043e600;
              auVar41 = vcmpps_avx(local_5a00._0_32_,auVar46._0_32_,6);
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                pRVar23 = (RTCIntersectArguments *)This->leafIntersector;
                auVar55._8_8_ = local_5a00._40_8_;
                auVar55._0_8_ = local_5a00._32_8_;
                local_5bc0._16_8_ = local_5a00._48_8_;
                local_5bc0._0_16_ = auVar55;
                local_5bc0._24_8_ = local_5a00._56_8_;
                auVar59 = ZEXT3264(local_5bc0);
                auVar52 = vpcmpeqd_avx(auVar71._0_16_,auVar71._0_16_);
                auVar71 = ZEXT1664(auVar52);
                auVar76 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar52);
                auVar52 = vpcmpgtd_avx(local_5c80._0_16_,auVar52);
                auVar31._16_16_ = auVar76;
                auVar31._0_16_ = auVar52;
                uVar24 = vmovmskps_avx(auVar31);
                if (uVar24 != 0) {
                  local_5c00 = _local_5c80;
                  uVar30 = (ulong)(uVar24 & 0xff);
                  local_5c40 = &pRVar23[(ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1].
                                context;
                  do {
                    local_5c20 = (RTCIntersectArguments *)0x0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> (long)local_5c20 & 1) == 0;
                          local_5c20 = (RTCIntersectArguments *)((long)local_5c20 + 1)) {
                      }
                    }
                    auVar59 = ZEXT1664(auVar59._0_16_);
                    auVar71 = ZEXT1664(auVar71._0_16_);
                    auVar89 = ZEXT1664(auVar89._0_16_);
                    auVar96 = ZEXT1664(auVar96._0_16_);
                    auVar99 = ZEXT1664(auVar99._0_16_);
                    auVar126 = ZEXT1664(auVar126._0_16_);
                    in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                    pRVar23 = (RTCIntersectArguments *)context;
                    cVar19 = (*(code *)*local_5c40)
                                       (&local_59c0,ray,local_5c20,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar55 = auVar59._0_16_;
                    if (cVar19 != '\0') {
                      *(undefined4 *)(local_5bc0 + (long)local_5c20 * 4) = 0xffffffff;
                    }
                    uVar30 = uVar30 & uVar30 - 1;
                  } while (uVar30 != 0);
                  auVar105 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar122 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  _local_5c80 = local_5c00;
                }
                _local_5c80 = vorps_avx(local_5bc0,_local_5c80);
                auVar52 = vpcmpeqd_avx(auVar55,auVar55);
                auVar76 = vpcmpgtd_avx(local_5c80._16_16_,auVar52);
                auVar52 = vpcmpgtd_avx(local_5c80._0_16_,auVar52);
                auVar52 = vpor_avx(auVar52,auVar76);
                if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar52[0xf]) goto LAB_0043e600;
                auVar58._8_4_ = 0xff800000;
                auVar58._0_8_ = 0xff800000ff800000;
                auVar58._12_4_ = 0xff800000;
                auVar58._16_4_ = 0xff800000;
                auVar58._20_4_ = 0xff800000;
                auVar58._24_4_ = 0xff800000;
                auVar58._28_4_ = 0xff800000;
                auVar59 = ZEXT3264(auVar58);
                local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar58,_local_5c80);
              }
              goto LAB_0043de7b;
            }
            pRVar23 = (RTCIntersectArguments *)(root.ptr & 0xfffffffffffffff0);
            auVar41 = auVar105._0_32_;
            pRVar28 = (RTCRayQueryContext *)0x8;
            do {
              pRVar4 = *(RTCRayQueryContext **)((long)&pRVar23[-0xe].flags + lVar27 * 8);
              if (pRVar4 == (RTCRayQueryContext *)0x8) {
                auVar46 = ZEXT3264(auVar41);
                break;
              }
              auVar59._28_36_ = auVar89._28_36_;
              auVar71._28_36_ = auVar96._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar24 = ((RTCRayQueryContext *)(root.ptr + -0xa0))->instID[lVar27];
                auVar36._4_4_ = uVar24;
                auVar36._0_4_ = uVar24;
                auVar36._8_4_ = uVar24;
                auVar36._12_4_ = uVar24;
                auVar36._16_4_ = uVar24;
                auVar36._20_4_ = uVar24;
                auVar36._24_4_ = uVar24;
                auVar36._28_4_ = uVar24;
                auVar16._4_4_ = local_5ba0._4_4_;
                auVar16._0_4_ = local_5ba0._0_4_;
                auVar16._8_4_ = local_5ba0._8_4_;
                auVar16._12_4_ = local_5ba0._12_4_;
                auVar16._16_4_ = local_5ba0._16_4_;
                auVar16._20_4_ = local_5ba0._20_4_;
                auVar16._24_4_ = local_5ba0._24_4_;
                auVar16._28_4_ = local_5ba0._28_4_;
                auVar17._4_4_ = local_5ba0._36_4_;
                auVar17._0_4_ = local_5ba0._32_4_;
                auVar17._8_4_ = local_5ba0._40_4_;
                auVar17._12_4_ = local_5ba0._44_4_;
                auVar17._16_4_ = local_5ba0._48_4_;
                auVar17._20_4_ = local_5ba0._52_4_;
                auVar17._24_4_ = local_5ba0._56_4_;
                auVar17._28_4_ = local_5ba0._60_4_;
                auVar18._4_4_ = local_5ba0._68_4_;
                auVar18._0_4_ = local_5ba0._64_4_;
                auVar18._8_4_ = local_5ba0._72_4_;
                auVar18._12_4_ = local_5ba0._76_4_;
                auVar18._16_4_ = local_5ba0._80_4_;
                auVar18._20_4_ = local_5ba0._84_4_;
                auVar18._24_4_ = local_5ba0._88_4_;
                auVar18._28_4_ = local_5ba0._92_4_;
                auVar69 = vsubps_avx(auVar36,auVar16);
                auVar59._0_4_ = (float)local_5ae0._0_4_ * auVar69._0_4_;
                auVar59._4_4_ = (float)local_5ae0._4_4_ * auVar69._4_4_;
                auVar59._8_4_ = fStack_5ad8 * auVar69._8_4_;
                auVar59._12_4_ = fStack_5ad4 * auVar69._12_4_;
                auVar59._16_4_ = fStack_5ad0 * auVar69._16_4_;
                auVar59._20_4_ = fStack_5acc * auVar69._20_4_;
                auVar59._24_4_ = fStack_5ac8 * auVar69._24_4_;
                auVar88 = auVar59._0_32_;
                uVar24 = ((RTCRayQueryContext *)(root.ptr + -0x60))->instID[lVar27];
                auVar37._4_4_ = uVar24;
                auVar37._0_4_ = uVar24;
                auVar37._8_4_ = uVar24;
                auVar37._12_4_ = uVar24;
                auVar37._16_4_ = uVar24;
                auVar37._20_4_ = uVar24;
                auVar37._24_4_ = uVar24;
                auVar37._28_4_ = uVar24;
                auVar69 = vsubps_avx(auVar37,auVar17);
                uVar24 = ((RTCRayQueryContext *)(root.ptr + -0x20))->instID[lVar27];
                auVar92._4_4_ = uVar24;
                auVar92._0_4_ = uVar24;
                auVar92._8_4_ = uVar24;
                auVar92._12_4_ = uVar24;
                auVar92._16_4_ = uVar24;
                auVar92._20_4_ = uVar24;
                auVar92._24_4_ = uVar24;
                auVar92._28_4_ = uVar24;
                auVar71._0_4_ = local_5ac0._0_4_ * auVar69._0_4_;
                auVar71._4_4_ = local_5ac0._4_4_ * auVar69._4_4_;
                auVar71._8_4_ = local_5ac0._8_4_ * auVar69._8_4_;
                auVar71._12_4_ = local_5ac0._12_4_ * auVar69._12_4_;
                auVar71._16_4_ = local_5ac0._16_4_ * auVar69._16_4_;
                auVar71._20_4_ = local_5ac0._20_4_ * auVar69._20_4_;
                auVar71._24_4_ = local_5ac0._24_4_ * auVar69._24_4_;
                auVar95 = auVar71._0_32_;
                auVar69 = vsubps_avx(auVar92,auVar18);
                auVar99._0_4_ = local_5aa0._0_4_ * auVar69._0_4_;
                auVar99._4_4_ = local_5aa0._4_4_ * auVar69._4_4_;
                auVar99._8_4_ = local_5aa0._8_4_ * auVar69._8_4_;
                auVar99._12_4_ = local_5aa0._12_4_ * auVar69._12_4_;
                auVar99._16_4_ = local_5aa0._16_4_ * auVar69._16_4_;
                auVar99._20_4_ = local_5aa0._20_4_ * auVar69._20_4_;
                auVar99._24_4_ = local_5aa0._24_4_ * auVar69._24_4_;
                auVar78 = auVar99._0_32_;
                auVar99 = ZEXT3264(auVar78);
                uVar24 = ((RTCRayQueryContext *)(root.ptr + -0x80))->instID[lVar27];
                auVar38._4_4_ = uVar24;
                auVar38._0_4_ = uVar24;
                auVar38._8_4_ = uVar24;
                auVar38._12_4_ = uVar24;
                auVar38._16_4_ = uVar24;
                auVar38._20_4_ = uVar24;
                auVar38._24_4_ = uVar24;
                auVar38._28_4_ = uVar24;
                auVar69 = vsubps_avx(auVar38,auVar16);
                auVar5._4_4_ = (float)local_5ae0._4_4_ * auVar69._4_4_;
                auVar5._0_4_ = (float)local_5ae0._0_4_ * auVar69._0_4_;
                auVar5._8_4_ = fStack_5ad8 * auVar69._8_4_;
                auVar5._12_4_ = fStack_5ad4 * auVar69._12_4_;
                auVar5._16_4_ = fStack_5ad0 * auVar69._16_4_;
                auVar5._20_4_ = fStack_5acc * auVar69._20_4_;
                auVar5._24_4_ = fStack_5ac8 * auVar69._24_4_;
                auVar5._28_4_ = local_5ba0._28_4_;
                uVar24 = ((RTCRayQueryContext *)(root.ptr + -0x40))->instID[lVar27];
                auVar39._4_4_ = uVar24;
                auVar39._0_4_ = uVar24;
                auVar39._8_4_ = uVar24;
                auVar39._12_4_ = uVar24;
                auVar39._16_4_ = uVar24;
                auVar39._20_4_ = uVar24;
                auVar39._24_4_ = uVar24;
                auVar39._28_4_ = uVar24;
                auVar69 = vsubps_avx(auVar39,auVar17);
                auVar6._4_4_ = local_5ac0._4_4_ * auVar69._4_4_;
                auVar6._0_4_ = local_5ac0._0_4_ * auVar69._0_4_;
                auVar6._8_4_ = local_5ac0._8_4_ * auVar69._8_4_;
                auVar6._12_4_ = local_5ac0._12_4_ * auVar69._12_4_;
                auVar6._16_4_ = local_5ac0._16_4_ * auVar69._16_4_;
                auVar6._20_4_ = local_5ac0._20_4_ * auVar69._20_4_;
                auVar6._24_4_ = local_5ac0._24_4_ * auVar69._24_4_;
                auVar6._28_4_ = local_5ba0._60_4_;
                uVar24 = ((RTCRayQueryContext *)root.ptr)->instID[lVar27];
                auVar40._4_4_ = uVar24;
                auVar40._0_4_ = uVar24;
                auVar40._8_4_ = uVar24;
                auVar40._12_4_ = uVar24;
                auVar40._16_4_ = uVar24;
                auVar40._20_4_ = uVar24;
                auVar40._24_4_ = uVar24;
                auVar40._28_4_ = uVar24;
                auVar69 = vsubps_avx(auVar40,auVar18);
                auVar7._4_4_ = local_5aa0._4_4_ * auVar69._4_4_;
                auVar7._0_4_ = local_5aa0._0_4_ * auVar69._0_4_;
                auVar7._8_4_ = local_5aa0._8_4_ * auVar69._8_4_;
                auVar7._12_4_ = local_5aa0._12_4_ * auVar69._12_4_;
                auVar7._16_4_ = local_5aa0._16_4_ * auVar69._16_4_;
                auVar7._20_4_ = local_5aa0._20_4_ * auVar69._20_4_;
                auVar7._24_4_ = local_5aa0._24_4_ * auVar69._24_4_;
                auVar7._28_4_ = local_5ba0._92_4_;
                auVar69 = vminps_avx(auVar88,auVar5);
                auVar35 = vminps_avx(auVar95,auVar6);
                auVar69 = vmaxps_avx(auVar69,auVar35);
                auVar35 = vminps_avx(auVar78,auVar7);
                auVar69 = vmaxps_avx(auVar69,auVar35);
                auVar44._4_4_ = auVar115._4_4_ * auVar69._4_4_;
                auVar44._0_4_ = auVar115._0_4_ * auVar69._0_4_;
                auVar44._8_4_ = auVar115._8_4_ * auVar69._8_4_;
                auVar44._12_4_ = auVar115._12_4_ * auVar69._12_4_;
                auVar44._16_4_ = auVar115._16_4_ * auVar69._16_4_;
                auVar44._20_4_ = auVar115._20_4_ * auVar69._20_4_;
                auVar44._24_4_ = auVar115._24_4_ * auVar69._24_4_;
                auVar44._28_4_ = auVar69._28_4_;
                auVar69 = vmaxps_avx(auVar88,auVar5);
                auVar35 = vmaxps_avx(auVar95,auVar6);
                auVar35 = vminps_avx(auVar69,auVar35);
                auVar69 = vmaxps_avx(auVar78,auVar7);
                auVar69 = vminps_avx(auVar35,auVar69);
                auVar8._4_4_ = auVar122._4_4_ * auVar69._4_4_;
                auVar8._0_4_ = auVar122._0_4_ * auVar69._0_4_;
                auVar8._8_4_ = auVar122._8_4_ * auVar69._8_4_;
                auVar8._12_4_ = auVar122._12_4_ * auVar69._12_4_;
                auVar8._16_4_ = auVar122._16_4_ * auVar69._16_4_;
                auVar8._20_4_ = auVar122._20_4_ * auVar69._20_4_;
                auVar8._24_4_ = auVar122._24_4_ * auVar69._24_4_;
                auVar8._28_4_ = auVar69._28_4_;
                auVar70 = vmaxps_avx(auVar44,local_5a20);
                auVar57 = vminps_avx(auVar8,local_5a00._0_32_);
              }
              else {
                fVar47 = *(float *)((long)&pRVar23[-5].flags + lVar27 * 4);
                fVar49 = *(float *)((long)&pRVar23[-4].flags + lVar27 * 4);
                fStack_5c38 = *(float *)((long)&pRVar23[-3].flags + lVar27 * 4);
                fVar50 = *(float *)((long)&pRVar23[-2].flags + lVar27 * 4);
                fVar51 = *(float *)((long)&pRVar23[-1].flags + lVar27 * 4);
                fVar84 = *(float *)((long)&pRVar23->flags + lVar27 * 4);
                fVar60 = *(float *)((long)&pRVar23[1].flags + lVar27 * 4);
                fVar62 = *(float *)((long)&pRVar23[2].flags + lVar27 * 4);
                fVar1 = *(float *)((long)&pRVar23[3].flags + lVar27 * 4);
                fStack_5c18 = *(float *)((long)&pRVar23[4].flags + lVar27 * 4);
                fVar123 = in_ZMM15._28_4_ + auVar122._28_4_;
                auVar114._0_4_ =
                     (float)local_5b40._0_4_ * fVar47 +
                     (float)local_5b20._0_4_ * fVar50 + fVar60 * (float)local_5b00._0_4_;
                auVar114._4_4_ =
                     (float)local_5b40._4_4_ * fVar47 +
                     (float)local_5b20._4_4_ * fVar50 + fVar60 * (float)local_5b00._4_4_;
                auVar114._8_4_ = fStack_5b38 * fVar47 + fStack_5b18 * fVar50 + fVar60 * fStack_5af8;
                auVar114._12_4_ = fStack_5b34 * fVar47 + fStack_5b14 * fVar50 + fVar60 * fStack_5af4
                ;
                auVar114._16_4_ = fStack_5b30 * fVar47 + fStack_5b10 * fVar50 + fVar60 * fStack_5af0
                ;
                auVar114._20_4_ = fStack_5b2c * fVar47 + fStack_5b0c * fVar50 + fVar60 * fStack_5aec
                ;
                auVar114._24_4_ = fStack_5b28 * fVar47 + fStack_5b08 * fVar50 + fVar60 * fStack_5ae8
                ;
                auVar114._28_4_ = fStack_5ae4 + fVar123;
                auVar125._0_4_ =
                     (float)local_5b40._0_4_ * fVar49 +
                     (float)local_5b20._0_4_ * fVar51 + fVar62 * (float)local_5b00._0_4_;
                auVar125._4_4_ =
                     (float)local_5b40._4_4_ * fVar49 +
                     (float)local_5b20._4_4_ * fVar51 + fVar62 * (float)local_5b00._4_4_;
                auVar125._8_4_ = fStack_5b38 * fVar49 + fStack_5b18 * fVar51 + fVar62 * fStack_5af8;
                auVar125._12_4_ = fStack_5b34 * fVar49 + fStack_5b14 * fVar51 + fVar62 * fStack_5af4
                ;
                auVar125._16_4_ = fStack_5b30 * fVar49 + fStack_5b10 * fVar51 + fVar62 * fStack_5af0
                ;
                auVar125._20_4_ = fStack_5b2c * fVar49 + fStack_5b0c * fVar51 + fVar62 * fStack_5aec
                ;
                auVar125._24_4_ = fStack_5b28 * fVar49 + fStack_5b08 * fVar51 + fVar62 * fStack_5ae8
                ;
                auVar125._28_4_ = fVar123 + in_ZMM15._28_4_ + auVar126._28_4_;
                fVar123 = *(float *)((long)&pRVar23[5].flags + lVar27 * 4);
                auVar104._0_4_ =
                     (float)local_5b40._0_4_ * fStack_5c38 +
                     (float)local_5b20._0_4_ * fVar84 + (float)local_5b00._0_4_ * fVar1;
                auVar104._4_4_ =
                     (float)local_5b40._4_4_ * fStack_5c38 +
                     (float)local_5b20._4_4_ * fVar84 + (float)local_5b00._4_4_ * fVar1;
                auVar104._8_4_ =
                     fStack_5b38 * fStack_5c38 + fStack_5b18 * fVar84 + fStack_5af8 * fVar1;
                auVar104._12_4_ =
                     fStack_5b34 * fStack_5c38 + fStack_5b14 * fVar84 + fStack_5af4 * fVar1;
                auVar104._16_4_ =
                     fStack_5b30 * fStack_5c38 + fStack_5b10 * fVar84 + fStack_5af0 * fVar1;
                auVar104._20_4_ =
                     fStack_5b2c * fStack_5c38 + fStack_5b0c * fVar84 + fStack_5aec * fVar1;
                auVar104._24_4_ =
                     fStack_5b28 * fStack_5c38 + fStack_5b08 * fVar84 + fStack_5ae8 * fVar1;
                auVar104._28_4_ = fStack_5b24 + fStack_5b04 + fStack_5ae4;
                auVar42._8_4_ = 0x7fffffff;
                auVar42._0_8_ = 0x7fffffff7fffffff;
                auVar42._12_4_ = 0x7fffffff;
                auVar42._16_4_ = 0x7fffffff;
                auVar42._20_4_ = 0x7fffffff;
                auVar42._24_4_ = 0x7fffffff;
                auVar42._28_4_ = 0x7fffffff;
                auVar69 = vandps_avx(auVar114,auVar42);
                auVar98._8_4_ = 0x219392ef;
                auVar98._0_8_ = 0x219392ef219392ef;
                auVar98._12_4_ = 0x219392ef;
                auVar98._16_4_ = 0x219392ef;
                auVar98._20_4_ = 0x219392ef;
                auVar98._24_4_ = 0x219392ef;
                auVar98._28_4_ = 0x219392ef;
                auVar69 = vcmpps_avx(auVar69,auVar98,1);
                auVar35 = vblendvps_avx(auVar114,auVar98,auVar69);
                auVar69 = vandps_avx(auVar125,auVar42);
                auVar69 = vcmpps_avx(auVar69,auVar98,1);
                auVar78 = vblendvps_avx(auVar125,auVar98,auVar69);
                auVar69 = vandps_avx(auVar104,auVar42);
                auVar69 = vcmpps_avx(auVar69,auVar98,1);
                auVar69 = vblendvps_avx(auVar104,auVar98,auVar69);
                auVar66 = vrcpps_avx(auVar35);
                fVar100 = auVar66._0_4_;
                fVar106 = auVar66._4_4_;
                auVar9._4_4_ = fVar106 * auVar35._4_4_;
                auVar9._0_4_ = fVar100 * auVar35._0_4_;
                fVar107 = auVar66._8_4_;
                auVar9._8_4_ = fVar107 * auVar35._8_4_;
                fVar108 = auVar66._12_4_;
                auVar9._12_4_ = fVar108 * auVar35._12_4_;
                fVar109 = auVar66._16_4_;
                auVar9._16_4_ = fVar109 * auVar35._16_4_;
                fVar110 = auVar66._20_4_;
                auVar9._20_4_ = fVar110 * auVar35._20_4_;
                fVar111 = auVar66._24_4_;
                auVar9._24_4_ = fVar111 * auVar35._24_4_;
                auVar9._28_4_ = auVar35._28_4_;
                auVar43._8_4_ = 0x3f800000;
                auVar43._0_8_ = 0x3f8000003f800000;
                auVar43._12_4_ = 0x3f800000;
                auVar43._16_4_ = 0x3f800000;
                auVar43._20_4_ = 0x3f800000;
                auVar43._24_4_ = 0x3f800000;
                auVar43._28_4_ = 0x3f800000;
                auVar67 = vsubps_avx(auVar43,auVar9);
                fVar100 = fVar100 + fVar100 * auVar67._0_4_;
                fVar106 = fVar106 + fVar106 * auVar67._4_4_;
                fVar107 = fVar107 + fVar107 * auVar67._8_4_;
                fVar108 = fVar108 + fVar108 * auVar67._12_4_;
                fVar109 = fVar109 + fVar109 * auVar67._16_4_;
                fVar110 = fVar110 + fVar110 * auVar67._20_4_;
                fVar111 = fVar111 + fVar111 * auVar67._24_4_;
                auVar35 = vrcpps_avx(auVar78);
                fVar112 = auVar35._0_4_;
                fVar116 = auVar35._4_4_;
                auVar10._4_4_ = fVar116 * auVar78._4_4_;
                auVar10._0_4_ = fVar112 * auVar78._0_4_;
                fVar117 = auVar35._8_4_;
                auVar10._8_4_ = fVar117 * auVar78._8_4_;
                fVar118 = auVar35._12_4_;
                auVar10._12_4_ = fVar118 * auVar78._12_4_;
                fVar119 = auVar35._16_4_;
                auVar10._16_4_ = fVar119 * auVar78._16_4_;
                fVar120 = auVar35._20_4_;
                auVar10._20_4_ = fVar120 * auVar78._20_4_;
                fVar121 = auVar35._24_4_;
                auVar10._24_4_ = fVar121 * auVar78._24_4_;
                auVar10._28_4_ = auVar78._28_4_;
                auVar68 = vsubps_avx(auVar43,auVar10);
                fVar112 = fVar112 + fVar112 * auVar68._0_4_;
                fVar116 = fVar116 + fVar116 * auVar68._4_4_;
                fVar117 = fVar117 + fVar117 * auVar68._8_4_;
                fVar118 = fVar118 + fVar118 * auVar68._12_4_;
                fVar119 = fVar119 + fVar119 * auVar68._16_4_;
                fVar120 = fVar120 + fVar120 * auVar68._20_4_;
                fVar121 = fVar121 + fVar121 * auVar68._24_4_;
                auVar78 = vrcpps_avx(auVar69);
                fVar124 = auVar78._0_4_;
                fVar127 = auVar78._4_4_;
                auVar11._4_4_ = fVar127 * auVar69._4_4_;
                auVar11._0_4_ = fVar124 * auVar69._0_4_;
                fVar128 = auVar78._8_4_;
                auVar11._8_4_ = fVar128 * auVar69._8_4_;
                fVar129 = auVar78._12_4_;
                auVar11._12_4_ = fVar129 * auVar69._12_4_;
                fVar130 = auVar78._16_4_;
                auVar11._16_4_ = fVar130 * auVar69._16_4_;
                fVar131 = auVar78._20_4_;
                auVar11._20_4_ = fVar131 * auVar69._20_4_;
                fVar132 = auVar78._24_4_;
                auVar11._24_4_ = fVar132 * auVar69._24_4_;
                auVar11._28_4_ = auVar69._28_4_;
                auVar69 = vsubps_avx(auVar43,auVar11);
                fVar124 = fVar124 + fVar124 * auVar69._0_4_;
                fVar127 = fVar127 + fVar127 * auVar69._4_4_;
                fVar128 = fVar128 + fVar128 * auVar69._8_4_;
                fVar129 = fVar129 + fVar129 * auVar69._12_4_;
                fVar130 = fVar130 + fVar130 * auVar69._16_4_;
                fVar131 = fVar131 + fVar131 * auVar69._20_4_;
                fVar132 = fVar132 + fVar132 * auVar69._24_4_;
                fVar2 = *(float *)((long)&pRVar23[6].flags + lVar27 * 4);
                fVar75 = fVar47 + fVar60 + fStack_5c18 + fVar50;
                auVar65._0_4_ =
                     -fVar100 *
                     ((float)local_5ba0._0_4_ * fVar47 +
                     fVar60 * (float)local_5ba0._64_4_ + fStack_5c18 +
                     (float)local_5ba0._32_4_ * fVar50);
                auVar65._4_4_ =
                     -fVar106 *
                     ((float)local_5ba0._4_4_ * fVar47 +
                     fVar60 * (float)local_5ba0._68_4_ + fStack_5c18 +
                     (float)local_5ba0._36_4_ * fVar50);
                auVar65._8_4_ =
                     -fVar107 *
                     ((float)local_5ba0._8_4_ * fVar47 +
                     fVar60 * (float)local_5ba0._72_4_ + fStack_5c18 +
                     (float)local_5ba0._40_4_ * fVar50);
                auVar65._12_4_ =
                     -fVar108 *
                     ((float)local_5ba0._12_4_ * fVar47 +
                     fVar60 * (float)local_5ba0._76_4_ + fStack_5c18 +
                     (float)local_5ba0._44_4_ * fVar50);
                fVar72 = -fVar109 *
                         ((float)local_5ba0._16_4_ * fVar47 +
                         fVar60 * (float)local_5ba0._80_4_ + fStack_5c18 +
                         (float)local_5ba0._48_4_ * fVar50);
                auVar12._16_4_ = fVar72;
                auVar12._0_16_ = auVar65;
                fVar73 = -fVar110 *
                         ((float)local_5ba0._20_4_ * fVar47 +
                         fVar60 * (float)local_5ba0._84_4_ + fStack_5c18 +
                         (float)local_5ba0._52_4_ * fVar50);
                auVar12._20_4_ = fVar73;
                fVar74 = -fVar111 *
                         ((float)local_5ba0._24_4_ * fVar47 +
                         fVar60 * (float)local_5ba0._88_4_ + fStack_5c18 +
                         (float)local_5ba0._56_4_ * fVar50);
                auVar12._24_4_ = fVar74;
                auVar12._28_4_ = fVar75;
                fVar63 = fVar49 + fVar123 + fVar62 + fVar51;
                auVar53._0_4_ =
                     -fVar112 *
                     ((float)local_5ba0._0_4_ * fVar49 +
                     fVar123 + fVar62 * (float)local_5ba0._64_4_ + (float)local_5ba0._32_4_ * fVar51
                     );
                auVar53._4_4_ =
                     -fVar116 *
                     ((float)local_5ba0._4_4_ * fVar49 +
                     fVar123 + fVar62 * (float)local_5ba0._68_4_ + (float)local_5ba0._36_4_ * fVar51
                     );
                auVar53._8_4_ =
                     -fVar117 *
                     ((float)local_5ba0._8_4_ * fVar49 +
                     fVar123 + fVar62 * (float)local_5ba0._72_4_ + (float)local_5ba0._40_4_ * fVar51
                     );
                auVar53._12_4_ =
                     -fVar118 *
                     ((float)local_5ba0._12_4_ * fVar49 +
                     fVar123 + fVar62 * (float)local_5ba0._76_4_ + (float)local_5ba0._44_4_ * fVar51
                     );
                fVar60 = -fVar119 *
                         ((float)local_5ba0._16_4_ * fVar49 +
                         fVar123 + fVar62 * (float)local_5ba0._80_4_ +
                         (float)local_5ba0._48_4_ * fVar51);
                auVar13._16_4_ = fVar60;
                auVar13._0_16_ = auVar53;
                fVar61 = -fVar120 *
                         ((float)local_5ba0._20_4_ * fVar49 +
                         fVar123 + fVar62 * (float)local_5ba0._84_4_ +
                         (float)local_5ba0._52_4_ * fVar51);
                auVar13._20_4_ = fVar61;
                fVar62 = -fVar121 *
                         ((float)local_5ba0._24_4_ * fVar49 +
                         fVar123 + fVar62 * (float)local_5ba0._88_4_ +
                         (float)local_5ba0._56_4_ * fVar51);
                auVar13._24_4_ = fVar62;
                auVar13._28_4_ = fVar63;
                fVar51 = fVar84 + fVar2 + fVar1 + -0.0;
                auVar32._0_4_ =
                     -fVar124 *
                     ((float)local_5ba0._0_4_ * fStack_5c38 +
                     (float)local_5ba0._32_4_ * fVar84 + fVar2 + (float)local_5ba0._64_4_ * fVar1);
                auVar32._4_4_ =
                     -fVar127 *
                     ((float)local_5ba0._4_4_ * fStack_5c38 +
                     (float)local_5ba0._36_4_ * fVar84 + fVar2 + (float)local_5ba0._68_4_ * fVar1);
                auVar32._8_4_ =
                     -fVar128 *
                     ((float)local_5ba0._8_4_ * fStack_5c38 +
                     (float)local_5ba0._40_4_ * fVar84 + fVar2 + (float)local_5ba0._72_4_ * fVar1);
                auVar32._12_4_ =
                     -fVar129 *
                     ((float)local_5ba0._12_4_ * fStack_5c38 +
                     (float)local_5ba0._44_4_ * fVar84 + fVar2 + (float)local_5ba0._76_4_ * fVar1);
                fVar47 = -fVar130 *
                         ((float)local_5ba0._16_4_ * fStack_5c38 +
                         (float)local_5ba0._48_4_ * fVar84 +
                         fVar2 + (float)local_5ba0._80_4_ * fVar1);
                auVar14._16_4_ = fVar47;
                auVar14._0_16_ = auVar32;
                fVar49 = -fVar131 *
                         ((float)local_5ba0._20_4_ * fStack_5c38 +
                         (float)local_5ba0._52_4_ * fVar84 +
                         fVar2 + (float)local_5ba0._84_4_ * fVar1);
                auVar14._20_4_ = fVar49;
                fVar50 = -fVar132 *
                         ((float)local_5ba0._24_4_ * fStack_5c38 +
                         (float)local_5ba0._56_4_ * fVar84 +
                         fVar2 + (float)local_5ba0._88_4_ * fVar1);
                auVar14._24_4_ = fVar50;
                auVar14._28_4_ = fVar51;
                auVar77._0_4_ = fVar100 + auVar65._0_4_;
                auVar77._4_4_ = fVar106 + auVar65._4_4_;
                auVar77._8_4_ = fVar107 + auVar65._8_4_;
                auVar77._12_4_ = fVar108 + auVar65._12_4_;
                auVar81._16_4_ = fVar109 + fVar72;
                auVar81._0_16_ = auVar77;
                auVar81._20_4_ = fVar110 + fVar73;
                auVar81._24_4_ = fVar111 + fVar74;
                auVar81._28_4_ = auVar66._28_4_ + auVar67._28_4_ + fVar75;
                auVar82._0_4_ = fVar112 + auVar53._0_4_;
                auVar82._4_4_ = fVar116 + auVar53._4_4_;
                auVar82._8_4_ = fVar117 + auVar53._8_4_;
                auVar82._12_4_ = fVar118 + auVar53._12_4_;
                auVar83._16_4_ = fVar119 + fVar60;
                auVar83._0_16_ = auVar82;
                auVar83._20_4_ = fVar120 + fVar61;
                auVar83._24_4_ = fVar121 + fVar62;
                auVar83._28_4_ = auVar35._28_4_ + auVar68._28_4_ + fVar63;
                auVar85._0_4_ = fVar124 + auVar32._0_4_;
                auVar85._4_4_ = fVar127 + auVar32._4_4_;
                auVar85._8_4_ = fVar128 + auVar32._8_4_;
                auVar85._12_4_ = fVar129 + auVar32._12_4_;
                auVar88._16_4_ = fVar130 + fVar47;
                auVar88._0_16_ = auVar85;
                auVar88._20_4_ = fVar131 + fVar49;
                auVar88._24_4_ = fVar132 + fVar50;
                auVar88._28_4_ = auVar78._28_4_ + auVar69._28_4_ + fVar51;
                auVar52 = vpminsd_avx(auVar12._16_16_,auVar81._16_16_);
                auVar76 = vpminsd_avx(auVar65,auVar77);
                auVar64 = vpminsd_avx(auVar13._16_16_,auVar83._16_16_);
                auVar52 = vpmaxsd_avx(auVar52,auVar64);
                auVar64 = vpminsd_avx(auVar53,auVar82);
                auVar76 = vpmaxsd_avx(auVar76,auVar64);
                auVar64 = vpminsd_avx(auVar32,auVar85);
                auVar76 = vpmaxsd_avx(auVar76,auVar64);
                auVar99 = ZEXT1664(auVar76);
                auVar48 = auVar14._16_16_;
                auVar126 = ZEXT1664(auVar48);
                auVar64 = vpminsd_avx(auVar48,auVar88._16_16_);
                in_ZMM15 = ZEXT1664(auVar64);
                auVar52 = vpmaxsd_avx(auVar52,auVar64);
                auVar95._16_16_ = auVar52;
                auVar95._0_16_ = auVar76;
                auVar64 = vpmaxsd_avx(auVar12._16_16_,auVar81._16_16_);
                auVar102 = vpmaxsd_avx(auVar65,auVar77);
                auVar97 = vpmaxsd_avx(auVar13._16_16_,auVar83._16_16_);
                auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar105 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar97 = vpminsd_avx(auVar64,auVar97);
                auVar64 = vpmaxsd_avx(auVar53,auVar82);
                auVar102 = vpminsd_avx(auVar102,auVar64);
                auVar64 = vpmaxsd_avx(auVar32,auVar85);
                auVar102 = vpminsd_avx(auVar102,auVar64);
                auVar64 = vpmaxsd_avx(auVar48,auVar88._16_16_);
                auVar122 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar64 = vpminsd_avx(auVar97,auVar64);
                auVar33._0_4_ = auVar76._0_4_ * 0.99999964;
                auVar33._4_4_ = auVar76._4_4_ * 0.99999964;
                auVar33._8_4_ = auVar76._8_4_ * 0.99999964;
                auVar33._12_4_ = auVar76._12_4_ * 0.99999964;
                auVar34._16_4_ = auVar52._0_4_ * 0.99999964;
                auVar34._0_16_ = auVar33;
                auVar34._20_4_ = auVar52._4_4_ * 0.99999964;
                auVar34._24_4_ = auVar52._8_4_ * 0.99999964;
                auVar44._28_4_ = 0;
                auVar44._0_28_ = auVar34;
                auVar54._0_4_ = auVar102._0_4_ * 1.0000004;
                auVar54._4_4_ = auVar102._4_4_ * 1.0000004;
                auVar54._8_4_ = auVar102._8_4_ * 1.0000004;
                auVar54._12_4_ = auVar102._12_4_ * 1.0000004;
                auVar15._16_4_ = auVar64._0_4_ * 1.0000004;
                auVar15._0_16_ = auVar54;
                auVar15._20_4_ = auVar64._4_4_ * 1.0000004;
                auVar15._24_4_ = auVar64._8_4_ * 1.0000004;
                auVar15._28_4_ = auVar64._12_4_;
                auVar52 = vpmaxsd_avx(auVar33,local_5a20._0_16_);
                auVar76._12_4_ = 0;
                auVar76._0_12_ = auVar34._16_12_;
                auVar76 = vpmaxsd_avx(auVar76,local_5a20._16_16_);
                auVar64 = vpminsd_avx(auVar54,local_5a00._0_16_);
                auVar70._16_16_ = auVar76;
                auVar70._0_16_ = auVar52;
                auVar52 = vpminsd_avx(auVar15._16_16_,local_5a00._16_16_);
                auVar57._16_16_ = auVar52;
                auVar57._0_16_ = auVar64;
                fStack_5c34 = fStack_5c38;
                fStack_5c30 = fStack_5c38;
                fStack_5c2c = fStack_5c38;
                fStack_5c28 = fStack_5c38;
                fStack_5c24 = fStack_5c38;
                fStack_5c14 = fStack_5c18;
                fStack_5c10 = fStack_5c18;
                fStack_5c0c = fStack_5c18;
                fStack_5c08 = fStack_5c18;
                fStack_5c04 = fStack_5c18;
              }
              auVar96 = ZEXT3264(auVar95);
              auVar89 = ZEXT3264(auVar88);
              auVar69 = vcmpps_avx(auVar70,auVar57,2);
              auVar52 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
              auVar59 = ZEXT1664(auVar52);
              auVar76 = vpmovzxwd_avx(auVar52);
              auVar64 = vpslld_avx(auVar76,0x1f);
              auVar71 = ZEXT1664(auVar64);
              auVar76 = vpunpckhwd_avx(auVar52,auVar52);
              auVar76 = vpslld_avx(auVar76,0x1f);
              auVar80._16_16_ = auVar76;
              auVar80._0_16_ = auVar64;
              if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar80 >> 0x7f,0) == '\0') &&
                    (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar76 >> 0x3f,0) == '\0') &&
                  (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar76[0xf]) {
                auVar46 = ZEXT3264(auVar41);
                pRVar4 = pRVar28;
              }
              else {
                auVar52 = vpunpckhwd_avx(auVar52,auVar52);
                auVar52 = vpslld_avx(auVar52,0x1f);
                auVar56._16_16_ = auVar52;
                auVar56._0_16_ = auVar64;
                auVar59 = ZEXT3264(auVar56);
                auVar69 = vblendvps_avx(auVar105._0_32_,auVar44,auVar56);
                auVar46 = ZEXT3264(auVar69);
                if (pRVar28 != (RTCRayQueryContext *)0x8) {
                  *puVar26 = (ulong)pRVar28;
                  puVar26 = puVar26 + 1;
                  *pauVar29 = auVar41;
                  pauVar29 = pauVar29 + 1;
                }
              }
              pRVar28 = pRVar4;
              lVar27 = lVar27 + 1;
              auVar41 = auVar46._0_32_;
            } while (lVar27 != 0x40);
            if (pRVar28 == (RTCRayQueryContext *)0x8) goto LAB_0043e380;
            auVar41 = vcmpps_avx(local_5a00._0_32_,auVar46._0_32_,6);
            uVar22 = vmovmskps_avx(auVar41);
            root.ptr = (size_t)pRVar28;
          } while ((byte)uVar25 < (byte)POPCOUNT(uVar22));
          *puVar26 = (ulong)pRVar28;
          puVar26 = puVar26 + 1;
          *pauVar29 = auVar46._0_32_;
          pauVar29 = pauVar29 + 1;
        }
        else {
          for (; local_5c58 = uVar30, local_5c20 != (RTCIntersectArguments *)0x0;
              local_5c20 = (RTCIntersectArguments *)
                           ((ulong)local_5c20 & (ulong)((long)&local_5c20[-1].intersect + 7U))) {
            local_5c40 = (RTCRayQueryContext **)0x0;
            if (local_5c20 != (RTCIntersectArguments *)0x0) {
              for (; ((ulong)local_5c20 >> (long)local_5c40 & 1) == 0;
                  local_5c40 = (RTCRayQueryContext **)((long)local_5c40 + 1)) {
              }
            }
            auVar59 = ZEXT1664(auVar59._0_16_);
            auVar71 = ZEXT1664(auVar71._0_16_);
            auVar89 = ZEXT1664(auVar89._0_16_);
            auVar96 = ZEXT1664(auVar96._0_16_);
            auVar99 = ZEXT1664(auVar99._0_16_);
            auVar126 = ZEXT1664(auVar126._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar20 = occluded1(This,local_5c50,root,(size_t)local_5c40,
                               (Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5ba0.field_0,context);
            auVar52 = auVar59._0_16_;
            if (bVar20) {
              *(undefined4 *)(local_5c80 + (long)local_5c40 * 4) = 0xffffffff;
            }
            auVar105 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar122 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            uVar30 = local_5c58;
          }
          auVar52 = vpcmpeqd_avx(auVar52,auVar52);
          auVar76 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar52);
          auVar52 = vpcmpgtd_avx(local_5c80._0_16_,auVar52);
          auVar59 = ZEXT1664(auVar52);
          auVar52 = vpor_avx(auVar52,auVar76);
          iVar21 = 3;
          if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar52[0xf] < '\0') {
            auVar41._8_4_ = 0xff800000;
            auVar41._0_8_ = 0xff800000ff800000;
            auVar41._12_4_ = 0xff800000;
            auVar41._16_4_ = 0xff800000;
            auVar41._20_4_ = 0xff800000;
            auVar41._24_4_ = 0xff800000;
            auVar41._28_4_ = 0xff800000;
            auVar59 = ZEXT3264(auVar41);
            local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar41,_local_5c80);
            iVar21 = 2;
          }
          auVar46 = ZEXT3264(local_5c00);
          pRVar23 = (RTCIntersectArguments *)0x0;
          if ((uint)uVar25 < (uint)local_5c58) goto LAB_0043deb8;
          pRVar23 = (RTCIntersectArguments *)0x0;
        }
LAB_0043e380:
      } while (iVar21 != 3);
LAB_0043e600:
      auVar41 = vandps_avx(local_5be0,_local_5c80);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      auVar45._16_4_ = 0xff800000;
      auVar45._20_4_ = 0xff800000;
      auVar45._24_4_ = 0xff800000;
      auVar45._28_4_ = 0xff800000;
      auVar41 = vmaskmovps_avx(auVar41,auVar45);
      *(undefined1 (*) [32])local_5c48 = auVar41;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }